

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rgb2spec_opt.cpp
# Opt level: O1

void eval_residual(double *coeffs,double *rgb,double *residual)

{
  undefined1 auVar1 [16];
  byte bVar2;
  bool bVar3;
  int i_1;
  long lVar4;
  undefined8 *in_RCX;
  int i;
  long lVar5;
  ulong uVar6;
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  double dVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [32];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  double out [3];
  double local_68;
  ulong uStack_60;
  long lStack_58;
  undefined1 local_48 [32];
  
  local_68 = 0.0;
  uStack_60 = 0;
  lStack_58 = 0;
  lVar5 = 0;
  auVar16 = ZEXT1664(ZEXT816(0x3ff0000000000000));
  local_48 = vpbroadcastq_avx512vl();
  auVar17 = ZEXT3264(local_48);
  auVar7 = vpmovsxwq_avx2(ZEXT816(0x11b008d80000));
  auVar18 = ZEXT3264(auVar7);
  uVar6 = 0x10aa07;
  do {
    auVar13._0_8_ = (lambda_tbl[lVar5] + -360.0) / 470.0;
    auVar13._8_8_ = 0;
    lVar4 = 0;
    auVar15 = ZEXT864(0) << 0x40;
    do {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = coeffs[lVar4];
      auVar1 = vfmadd213sd_fma(auVar15._0_16_,auVar13,auVar1);
      auVar15 = ZEXT1664(auVar1);
      lVar4 = lVar4 + 1;
    } while (lVar4 != 3);
    auVar13 = vfmadd213sd_fma(auVar1,auVar1,auVar16._0_16_);
    if (auVar13._0_8_ < 0.0) {
      dVar12 = sqrt(auVar13._0_8_);
      uVar6 = 0xaa07;
      auVar7 = vpmovsxwq_avx2(ZEXT816(0x11b008d80000));
      auVar18 = ZEXT3264(auVar7);
      auVar17 = ZEXT3264(local_48);
      auVar16 = ZEXT1664(ZEXT816(0x3ff0000000000000));
    }
    else {
      auVar13 = vsqrtsd_avx(auVar13,auVar13);
      dVar12 = auVar13._0_8_;
    }
    dVar12 = (auVar1._0_8_ * 0.5) / dVar12 + 0.5;
    auVar14._8_8_ = dVar12;
    auVar14._0_8_ = dVar12;
    auVar14._16_8_ = dVar12;
    auVar14._24_8_ = dVar12;
    auVar7 = vpbroadcastq_avx512vl();
    auVar7 = vpsllq_avx2(auVar7,3);
    auVar7 = vpaddq_avx2(auVar17._0_32_,auVar7);
    vpaddq_avx2(auVar18._0_32_,auVar7);
    auVar7 = vgatherqpd_avx512vl(*in_RCX);
    bVar2 = (byte)uVar6;
    auVar8._8_8_ = (ulong)((byte)(uVar6 >> 1) & 1) * auVar7._8_8_;
    auVar8._0_8_ = (ulong)(bVar2 & 1) * auVar7._0_8_;
    auVar8._16_8_ = (ulong)((byte)(uVar6 >> 2) & 1) * auVar7._16_8_;
    auVar8._24_8_ = 0;
    auVar7._8_8_ = ((byte)(uVar6 >> 1) & 1) * uStack_60;
    auVar7._0_8_ = (ulong)(bVar2 & 1) * (long)local_68;
    auVar7._16_8_ = (ulong)((byte)(uVar6 >> 2) & 1) * lStack_58;
    auVar7._24_8_ = 0;
    auVar13 = vfmadd231pd_fma(auVar7,auVar14,auVar8);
    local_68 = (double)((ulong)(bVar2 & 1) * auVar13._0_8_ |
                       (ulong)!(bool)(bVar2 & 1) * (long)local_68);
    bVar3 = (bool)((byte)(uVar6 >> 1) & 1);
    uStack_60 = (ulong)bVar3 * auVar13._8_8_ | !bVar3 * uStack_60;
    lStack_58 = (ulong)!(bool)((byte)(uVar6 >> 2) & 1) * lStack_58;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0x11b);
  cie_lab(&local_68);
  residual[2] = rgb[2];
  dVar12 = rgb[1];
  *residual = *rgb;
  residual[1] = dVar12;
  cie_lab(residual);
  auVar9._8_8_ = uStack_60;
  auVar9._0_8_ = local_68;
  auVar9._16_8_ = lStack_58;
  auVar9._24_8_ = 0;
  auVar10._0_24_ = SUB3224(*(undefined1 (*) [32])residual,0);
  auVar10._24_8_ = 0;
  auVar7 = vsubpd_avx(auVar10,auVar9);
  auVar11._0_24_ = auVar7._0_24_;
  auVar11._24_8_ = residual[3];
  *(undefined1 (*) [32])residual = auVar11;
  return;
}

Assistant:

void eval_residual(const double *coeffs, const double *rgb, double *residual) {
    double out[3] = {0.0, 0.0, 0.0};

    for (int i = 0; i < CIE_FINE_SAMPLES; ++i) {
        /* Scale lambda to 0..1 range */
        double lambda =
            (lambda_tbl[i] - CIE_LAMBDA_MIN) / (CIE_LAMBDA_MAX - CIE_LAMBDA_MIN);

        /* Polynomial */
        double x = 0.0;
        for (int i = 0; i < 3; ++i)
            x = x * lambda + coeffs[i];

        /* Sigmoid */
        double s = sigmoid(x);

        /* Integrate against precomputed curves */
        for (int j = 0; j < 3; ++j)
            out[j] += rgb_tbl[j][i] * s;
    }
    cie_lab(out);
    memcpy(residual, rgb, sizeof(double) * 3);
    cie_lab(residual);

    for (int j = 0; j < 3; ++j)
        residual[j] -= out[j];
}